

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
ptc::(anonymous_namespace)::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          duration<long,_std::ratio<1L,_1000000L>_> *val)

{
  initializer_list<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  __l;
  basic_string_view<char,_std::char_traits<char>_> __str;
  duration<long,_std::ratio<1L,_1000000L>_> *this;
  int iVar1;
  conditional_t<std::is_same_v<char,_char>,_const_std::basic_string<char>_&,_std::basic_string<char>_>
  pbVar2;
  rep rVar3;
  basic_ostream<char,_std::char_traits<char>_> *__os;
  mapped_type *pmVar4;
  type_index local_190;
  size_t local_188;
  char *local_180;
  allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_174;
  key_equal local_173;
  hasher local_172;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_c1;
  string local_c0;
  pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_> local_a0;
  pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_> local_88;
  pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_> local_70;
  pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_> local_58;
  pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_> local_40;
  iterator local_28;
  size_type local_20;
  duration<long,_std::ratio<1L,_1000000L>_> *local_18;
  duration<long,_std::ratio<1L,_1000000L>_> *val_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  local_18 = val;
  val_local = (duration<long,_std::ratio<1L,_1000000L>_> *)os;
  if (operator<<<char,std::
      ratio<1l,1000000l>,long>(std::ostream&,std::chrono::duration<long,std::ratio<long,long>>const&)
      ::time_map == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<<char,std::
                                 ratio<1l,1000000l>,long>(std::ostream&,std::chrono::duration<long,std::ratio<long,long>>const&)
                                 ::time_map);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"ns",&local_c1);
      pbVar2 = anon_unknown_8::StringConverter<char>(&local_c0);
      std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<const_std::type_info_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_a0,(type_info *)&std::ratio<1l,1000000000l>::typeinfo,pbVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"us",&local_f9);
      pbVar2 = anon_unknown_8::StringConverter<char>(&local_f8);
      std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<const_std::type_info_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_88,(type_info *)&std::ratio<1l,1000000l>::typeinfo,pbVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"ms",&local_121);
      pbVar2 = anon_unknown_8::StringConverter<char>(&local_120);
      std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<const_std::type_info_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_70,(type_info *)&std::ratio<1l,1000l>::typeinfo,pbVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"min",&local_149);
      pbVar2 = anon_unknown_8::StringConverter<char>(&local_148);
      std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<const_std::type_info_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_58,(type_info *)&std::ratio<60l,1l>::typeinfo,pbVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"h",&local_171);
      pbVar2 = anon_unknown_8::StringConverter<char>(&local_170);
      std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>::
      pair<const_std::type_info_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_40,(type_info *)&std::ratio<3600l,1l>::typeinfo,pbVar2);
      local_28 = &local_a0;
      local_20 = 5;
      std::
      allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::allocator(&local_174);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::
      unordered_map<std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::unordered_map(&anon_unknown_8::operator<<<char,_std::ratio<1L,_1000000L>,_long>::time_map,
                      __l,0,&local_172,&local_173,&local_174);
      std::
      allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~allocator(&local_174);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      __cxa_atexit(std::
                   unordered_map<std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ::~unordered_map,
                   &anon_unknown_8::operator<<<char,_std::ratio<1L,_1000000L>,_long>::time_map,
                   &__dso_handle);
      __cxa_guard_release(&operator<<<char,std::
                           ratio<1l,1000000l>,long>(std::ostream&,std::chrono::duration<long,std::ratio<long,long>>const&)
                           ::time_map);
    }
  }
  this = val_local;
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(local_18);
  __os = (basic_ostream<char,_std::char_traits<char>_> *)std::ostream::operator<<(this,rVar3);
  std::type_index::type_index(&local_190,(type_info *)&std::ratio<1l,1000000l>::typeinfo);
  pmVar4 = std::
           unordered_map<std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           ::operator[](&anon_unknown_8::operator<<<char,_std::ratio<1L,_1000000L>,_long>::time_map,
                        &local_190);
  local_188 = pmVar4->_M_len;
  local_180 = pmVar4->_M_str;
  __str._M_len = pmVar4->_M_len;
  __str._M_str = pmVar4->_M_str;
  std::operator<<(__os,__str);
  return (basic_ostream<char,_std::char_traits<char>_> *)val_local;
}

Assistant:

std::basic_ostream<T_str>& operator <<( std::basic_ostream<T_str>& os, const std::chrono::duration<int_type, T_time>& val )
     {
      if constexpr( ! std::is_same_v<std::chrono::duration<int_type, T_time>, std::chrono::duration<int_type>> )
       {
        static std::unordered_map<std::type_index, std::basic_string_view<T_str>> time_map
         {
          { typeid( std::nano ), StringConverter<T_str>( "ns" ) },
          { typeid( std::micro ), StringConverter<T_str>( "us" ) },
          { typeid( std::milli ), StringConverter<T_str>( "ms" ) },
          { typeid( std::ratio<60> ), StringConverter<T_str>( "min" ) },
          { typeid( std::ratio<3600> ), StringConverter<T_str>( "h" ) }
         };
  
        #if ( __cplusplus >= 202002L )
        time_map.insert( { typeid( std::ratio<86400> ), StringConverter<T_str>( "d" ) } );
        time_map.insert( { typeid( std::ratio<604800> ), StringConverter<T_str>( "w" ) } );
        time_map.insert( { typeid( std::ratio<2629746> ), StringConverter<T_str>( "mos" ) } );
        time_map.insert( { typeid( std::ratio<31556952> ), StringConverter<T_str>( "y" ) } );
        #endif
         
        os << val.count() << time_map[ typeid( T_time ) ];
       }
      else if constexpr( std::is_same_v<std::chrono::duration<int_type, T_time>, std::chrono::duration<int_type>> )
       {
        os << val.count() << 's';
       }
  
      return os;
     }